

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O0

void __thiscall Test_aistr_assign_Test::TestBody(Test_aistr_assign_Test *this)

{
  char (*pacVar1) [10];
  bool bVar2;
  char *pcVar3;
  AssertHelper local_178;
  Message local_170;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  Message local_128;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  Message local_50 [2];
  invalid_argument *anon_var_0;
  byte local_29;
  char *pcStack_28;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  char buf [10];
  Test_aistr_assign_Test *this_local;
  
  memset((void *)((long)&gtest_msg.value + 6),0,10);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffd8,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffd8);
  if (bVar2) {
    local_29 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      ai::assign<10ul>((char (*) [10])((long)&gtest_msg.value + 6),(char *)0x0);
    }
    if ((local_29 & 1) != 0) goto LAB_00118655;
    pcStack_28 = 
    "Expected: ai::assign(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_50);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x45,pcStack_28);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_50);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_50);
LAB_00118655:
  pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
  ai::assign<10ul>(pacVar1,"1234");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)pacVar1,&local_89);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
            ((EqHelper<false> *)local_68,"std::string(buf)","\"1234\"",&local_88,
             (char (*) [5])0x155ff5);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  anon_var_0._0_4_ = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if ((uint)anon_var_0 == 0) {
    pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
    ai::assign<10ul>(pacVar1,"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,(char *)pacVar1,&local_d1);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[1]>
              ((EqHelper<false> *)local_b0,"std::string(buf)","\"\"",&local_d0,
               (char (*) [1])0x1582bb);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x4a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_e0);
    }
    anon_var_0._0_4_ = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    if ((uint)anon_var_0 == 0) {
      pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
      ai::assign<10ul>(pacVar1,"123456789");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,(char *)pacVar1,&local_119);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[10]>
                ((EqHelper<false> *)local_f8,"std::string(buf)","\"123456789\"",&local_118,
                 (char (*) [10])"123456789");
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar2) {
        testing::Message::Message(&local_128);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x4d,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_128);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_128);
      }
      anon_var_0._0_4_ = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      if ((uint)anon_var_0 == 0) {
        pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
        ai::assign<10ul>(pacVar1,"12345678901");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,(char *)pacVar1,&local_161);
        testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[10]>
                  ((EqHelper<false> *)local_140,"std::string(buf)","\"123456789\"",&local_160,
                   (char (*) [10])"123456789");
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
        if (!bVar2) {
          testing::Message::Message(&local_170);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x50,pcVar3);
          testing::internal::AssertHelper::operator=(&local_178,&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          testing::Message::~Message(&local_170);
        }
        anon_var_0._0_4_ = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, assign) {
    char buf[10] = {0};

    EXPECT_THROW(ai::assign(buf, nullptr), std::invalid_argument);

    ai::assign(buf, "1234");
    ASSERT_EQ(std::string(buf), "1234");
    ai::assign(buf, "");
    ASSERT_EQ(std::string(buf), "");

    ai::assign(buf, "123456789");
    ASSERT_EQ(std::string(buf), "123456789");

    ai::assign(buf, "12345678901");
    ASSERT_EQ(std::string(buf), "123456789");
}